

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  uint8_t uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  ushort uVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int *piVar24;
  size_t sVar25;
  char *pcVar26;
  ushort uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  size_t *psVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  ulong local_100;
  ulong local_e0;
  ulong local_b0;
  uint local_70;
  
  local_e0 = *(ulong *)dist_cache;
  uVar2 = position + num_bytes;
  uVar12 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    uVar12 = position;
  }
  lVar35 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar35 = 0x40;
  }
  psVar40 = last_insert_len;
  if (uVar2 <= position + 8) {
LAB_00102375:
    *(ulong *)dist_cache = (local_e0 + uVar2) - position;
    *(long *)commands = *(long *)commands + ((long)psVar40 - (long)last_insert_len >> 4);
    return;
  }
  uVar37 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  lVar6 = *(long *)(literal_context_lut + 0x10);
  local_b0 = lVar35 + position;
  lVar7 = *(long *)&(params->hasher).num_last_distances_to_check;
  uVar1 = uVar2 - 7;
  lVar4 = position - 1;
  sVar25 = position;
LAB_00101516:
  uVar18 = uVar2 - sVar25;
  uVar13 = uVar37;
  if (sVar25 < uVar37) {
    uVar13 = sVar25;
  }
  uVar38 = lVar6 + sVar25;
  if (uVar37 <= lVar6 + sVar25) {
    uVar38 = uVar37;
  }
  uVar8 = *(ulong *)(literal_context_lut + 0x50);
  uVar16 = sVar25 & ringbuffer_mask;
  piVar3 = (int *)(ringbuffer + uVar16);
  uVar5 = ringbuffer[uVar16];
  uVar36 = (ulong)(*(long *)(ringbuffer + uVar16) * -0x42e1ca5843000000) >> 0x30;
  local_100 = (ulong)*(int *)&(hasher->common).extra;
  local_70 = (uint)ringbuffer_mask;
  if ((sVar25 <= sVar25 - local_100) ||
     (uVar21 = (ulong)((uint)(sVar25 - local_100) & local_70), uVar5 != ringbuffer[uVar21])) {
LAB_00101656:
    uVar33 = *(uint *)(lVar7 + uVar36 * 4);
    *(int *)(lVar7 + uVar36 * 4) = (int)sVar25;
    uVar36 = (ulong)(local_70 & uVar33);
    if (uVar5 != ringbuffer[uVar36]) goto LAB_001017aa;
    iVar17 = 0;
    if ((sVar25 == uVar33) || (local_100 = sVar25 - uVar33, uVar13 < local_100)) {
      local_100 = 0;
      uVar41 = 0;
      uVar21 = 0x7e4;
      goto LAB_001017cd;
    }
    if (7 < uVar18) {
      uVar13 = uVar18 & 0xfffffffffffffff8;
      piVar24 = (int *)(ringbuffer + uVar13 + uVar16);
      lVar20 = 0;
      uVar16 = 0;
LAB_001016cd:
      if (*(ulong *)(piVar3 + uVar16 * 2) == *(ulong *)(ringbuffer + uVar16 * 8 + uVar36))
      goto code_r0x001016da;
      uVar16 = *(ulong *)(ringbuffer + uVar16 * 8 + uVar36) ^ *(ulong *)(piVar3 + uVar16 * 2);
      uVar13 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      uVar41 = (uVar13 >> 3 & 0x1fffffff) - lVar20;
      goto LAB_0010171c;
    }
    uVar13 = 0;
    piVar24 = piVar3;
LAB_0010227b:
    uVar16 = uVar18 & 7;
    uVar41 = uVar13;
    if (uVar16 != 0) {
      uVar21 = uVar13 | uVar16;
      do {
        uVar41 = uVar13;
        if (ringbuffer[uVar13 + uVar36] != (uint8_t)*piVar24) break;
        piVar24 = (int *)((long)piVar24 + 1);
        uVar13 = uVar13 + 1;
        uVar16 = uVar16 - 1;
        uVar41 = uVar21;
      } while (uVar16 != 0);
    }
LAB_0010171c:
    if (3 < uVar41) {
      iVar34 = 0x1f;
      if ((uint)local_100 != 0) {
        for (; (uint)local_100 >> iVar34 == 0; iVar34 = iVar34 + -1) {
        }
      }
      uVar21 = (ulong)(iVar34 * -0x1e + 0x780) + uVar41 * 0x87;
      if (0x7e4 < uVar21) goto LAB_001017cd;
    }
    lVar20 = *(long *)&(params->hasher).block_bits;
    if (*(ulong *)(lVar20 + 0x10) < *(ulong *)(lVar20 + 8) >> 7) {
LAB_001017aa:
      iVar17 = 0;
      uVar21 = 0x7e4;
      local_100 = 0;
      uVar41 = 0;
      goto LAB_001017cd;
    }
    iVar17 = *piVar3;
    lVar9 = *(long *)(literal_context_lut + 0x78);
    *(long *)(lVar20 + 8) = *(long *)(lVar20 + 8) + 1;
    uVar13 = (ulong)((uint)(iVar17 * 0x1e35a7bd) >> 0x12);
    bVar14 = *(byte *)(lVar9 + uVar13 * 2);
    uVar16 = (ulong)bVar14;
    if (uVar16 == 0) goto LAB_001017aa;
    bVar43 = true;
    uVar21 = 0x7e4;
    if (uVar16 <= uVar18) {
      uVar13 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar13 * 4);
      lVar9 = *(long *)(literal_context_lut + 0x58);
      pcVar26 = (char *)(uVar13 * uVar16 + *(long *)(lVar9 + 0xa8) +
                        (ulong)*(uint *)(lVar9 + 0x20 + uVar16 * 4));
      if (7 < bVar14) {
        uVar36 = (ulong)(bVar14 & 0xfffffff8);
        lVar22 = 0;
        uVar21 = 0;
LAB_00101e0a:
        if (*(ulong *)(pcVar26 + uVar21 * 8) == *(ulong *)(piVar3 + uVar21 * 2))
        goto code_r0x00101e17;
        uVar21 = *(ulong *)(piVar3 + uVar21 * 2) ^ *(ulong *)(pcVar26 + uVar21 * 8);
        uVar36 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        uVar41 = (uVar36 >> 3 & 0x1fffffff) - lVar22;
        goto LAB_00101e4c;
      }
      uVar36 = 0;
      goto LAB_00102305;
    }
    iVar17 = 0;
    local_100 = 0;
    uVar41 = 0;
    goto LAB_00102259;
  }
  if (7 < uVar18) {
    uVar19 = uVar18 & 0xfffffffffffffff8;
    piVar24 = (int *)(ringbuffer + uVar19 + uVar16);
    lVar20 = 0;
    uVar41 = 0;
LAB_001015c8:
    if (*(ulong *)(piVar3 + uVar41 * 2) == *(ulong *)(ringbuffer + uVar41 * 8 + uVar21))
    goto code_r0x001015d5;
    uVar19 = *(ulong *)(ringbuffer + uVar41 * 8 + uVar21) ^ *(ulong *)(piVar3 + uVar41 * 2);
    uVar21 = 0;
    if (uVar19 != 0) {
      for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
      }
    }
    uVar41 = (uVar21 >> 3 & 0x1fffffff) - lVar20;
    goto LAB_00101608;
  }
  uVar19 = 0;
  piVar24 = piVar3;
LAB_001022b7:
  uVar23 = uVar18 & 7;
  uVar41 = uVar19;
  if (uVar23 != 0) {
    uVar32 = uVar19 | uVar23;
    do {
      uVar41 = uVar19;
      if (ringbuffer[uVar19 + uVar21] != (uint8_t)*piVar24) break;
      piVar24 = (int *)((long)piVar24 + 1);
      uVar19 = uVar19 + 1;
      uVar23 = uVar23 - 1;
      uVar41 = uVar32;
    } while (uVar23 != 0);
  }
LAB_00101608:
  if ((uVar41 < 4) || (uVar21 = uVar41 * 0x87 + 0x78f, uVar21 < 0x7e5)) goto LAB_00101656;
  *(int *)(lVar7 + uVar36 * 4) = (int)sVar25;
  iVar17 = 0;
  goto LAB_001017cd;
code_r0x001015d5:
  uVar41 = uVar41 + 1;
  lVar20 = lVar20 + -8;
  if (uVar18 >> 3 == uVar41) goto LAB_001022b7;
  goto LAB_001015c8;
code_r0x001016da:
  uVar16 = uVar16 + 1;
  lVar20 = lVar20 + -8;
  if (uVar18 >> 3 == uVar16) goto LAB_0010227b;
  goto LAB_001016cd;
code_r0x00101e17:
  uVar21 = uVar21 + 1;
  lVar22 = lVar22 + -8;
  if (bVar14 >> 3 == uVar21) goto code_r0x00101e23;
  goto LAB_00101e0a;
code_r0x00101e23:
  pcVar26 = pcVar26 + -lVar22;
LAB_00102305:
  uVar21 = uVar16 & 7;
  uVar41 = uVar36;
  if ((bVar14 & 7) != 0) {
    uVar19 = uVar36 | uVar21;
    do {
      uVar41 = uVar36;
      if (*(char *)((long)piVar3 + uVar36) != *pcVar26) break;
      pcVar26 = pcVar26 + 1;
      uVar36 = uVar36 + 1;
      uVar21 = uVar21 - 1;
      uVar41 = uVar19;
    } while (uVar21 != 0);
  }
LAB_00101e4c:
  iVar17 = 0;
  uVar21 = 0x7e4;
  if ((uVar41 == 0) || (*(uint *)(literal_context_lut + 100) + uVar41 <= uVar16)) {
    local_100 = 0;
    uVar41 = 0;
  }
  else {
    local_100 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                               ((char)(uVar16 - uVar41) * '\x06' & 0x3fU)) & 0x3f) +
                 (uVar16 - uVar41) * 4 << (*(byte *)(lVar9 + uVar16) & 0x3f)) + uVar38 + 1 + uVar13;
    if (local_100 <= uVar8) {
      iVar17 = 0x1f;
      if ((uint)local_100 != 0) {
        for (; (uint)local_100 >> iVar17 == 0; iVar17 = iVar17 + -1) {
        }
      }
      uVar21 = (uVar41 * 0x87 - (ulong)(uint)(iVar17 * 0x1e)) + 0x780;
      if (0x7e3 < uVar21) {
        iVar17 = (uint)bVar14 - (int)uVar41;
        bVar43 = false;
        goto LAB_00102259;
      }
    }
    iVar17 = 0;
    local_100 = 0;
    uVar41 = 0;
    uVar21 = 0x7e4;
  }
LAB_00102259:
  if (!bVar43) {
    *(long *)(lVar20 + 0x10) = *(long *)(lVar20 + 0x10) + 1;
  }
LAB_001017cd:
  if (0x7e4 < uVar21) {
    uVar13 = (ulong)*(int *)&(hasher->common).extra;
    uVar38 = (lVar4 + num_bytes) - sVar25;
    iVar34 = 0;
LAB_001017f1:
    uVar18 = uVar18 - 1;
    uVar16 = uVar41 - 1;
    if (uVar18 <= uVar41 - 1) {
      uVar16 = uVar18;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar16 = 0;
    }
    uVar36 = sVar25 + 1;
    uVar19 = uVar37;
    if (uVar36 < uVar37) {
      uVar19 = uVar36;
    }
    uVar23 = lVar6 + sVar25 + 1;
    if (uVar37 <= uVar23) {
      uVar23 = uVar37;
    }
    piVar3 = (int *)(ringbuffer + (uVar36 & ringbuffer_mask));
    uVar5 = *(uint8_t *)(uVar16 + (long)piVar3);
    uVar42 = (ulong)(*(long *)(ringbuffer + (uVar36 & ringbuffer_mask)) * -0x42e1ca5843000000) >>
             0x30;
    uVar32 = uVar36 - uVar13;
    if ((uVar32 < uVar36) &&
       (uVar33 = (uint)uVar32 & local_70, uVar5 == ringbuffer[uVar16 + uVar33])) {
      if (7 < uVar18) {
        lVar20 = 0;
        uVar32 = 0;
LAB_001018b1:
        if (*(ulong *)(piVar3 + uVar32 * 2) == *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar33))
        goto code_r0x001018be;
        uVar30 = *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar33) ^
                 *(ulong *)(piVar3 + uVar32 * 2);
        uVar32 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
          }
        }
        uVar32 = (uVar32 >> 3 & 0x1fffffff) - lVar20;
        goto LAB_001018ee;
      }
      uVar32 = 0;
      piVar24 = piVar3;
      goto LAB_00101c2e;
    }
    goto LAB_00101930;
  }
  local_e0 = local_e0 + 1;
  position = sVar25 + 1;
  if ((num_literals == (size_t *)0x0) && (local_b0 < position)) {
    if ((uint)((int)lVar35 * 4) + local_b0 < position) {
      uVar13 = sVar25 + 0x11;
      if (uVar1 <= sVar25 + 0x11) {
        uVar13 = uVar1;
      }
      for (; position < uVar13; position = position + 4) {
        *(int *)(lVar7 + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                 -0x42e1ca5843000000) >> 0x30) * 4) = (int)position;
        local_e0 = local_e0 + 4;
      }
    }
    else {
      uVar13 = sVar25 + 9;
      if (uVar1 <= sVar25 + 9) {
        uVar13 = uVar1;
      }
      for (; position < uVar13; position = position + 2) {
        *(int *)(lVar7 + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                 -0x42e1ca5843000000) >> 0x30) * 4) = (int)position;
        local_e0 = local_e0 + 2;
      }
    }
  }
  goto LAB_0010219d;
code_r0x001018be:
  uVar32 = uVar32 + 1;
  lVar20 = lVar20 + -8;
  if (uVar38 >> 3 == uVar32) goto code_r0x001018ca;
  goto LAB_001018b1;
code_r0x001018ca:
  uVar32 = -lVar20;
  piVar24 = (int *)((long)piVar3 - lVar20);
LAB_00101c2e:
  uVar30 = uVar18 & 7;
  for (; (uVar30 != 0 && (ringbuffer[uVar32 + uVar33] == (uint8_t)*piVar24)); uVar32 = uVar32 + 1) {
    piVar24 = (int *)((long)piVar24 + 1);
    uVar30 = uVar30 - 1;
  }
LAB_001018ee:
  if ((uVar32 < 4) || (uVar30 = uVar32 * 0x87 + 0x78f, uVar30 < 0x7e5)) {
LAB_00101930:
    uVar33 = *(uint *)(lVar7 + uVar42 * 4);
    *(int *)(lVar7 + uVar42 * 4) = (int)uVar36;
    uVar28 = local_70 & uVar33;
    uVar30 = 0x7e4;
    if (uVar5 == ringbuffer[uVar16 + uVar28]) {
      iVar39 = 0;
      if ((uVar36 != uVar33) && (uVar16 = uVar36 - uVar33, uVar16 <= uVar19)) {
        if (7 < uVar18) {
          lVar20 = 0;
          uVar19 = 0;
LAB_00101980:
          if (*(ulong *)(piVar3 + uVar19 * 2) == *(ulong *)(ringbuffer + uVar19 * 8 + (ulong)uVar28)
             ) goto code_r0x0010198d;
          uVar32 = *(ulong *)(ringbuffer + uVar19 * 8 + (ulong)uVar28) ^
                   *(ulong *)(piVar3 + uVar19 * 2);
          uVar19 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          uVar32 = (uVar19 >> 3 & 0x1fffffff) - lVar20;
          goto LAB_001019ca;
        }
        uVar32 = 0;
        piVar24 = piVar3;
        goto LAB_00101bfe;
      }
      goto LAB_00101a5b;
    }
    uVar16 = 0;
    uVar32 = 0;
  }
  else {
    *(int *)(lVar7 + uVar42 * 4) = (int)uVar36;
    uVar16 = uVar13;
  }
  iVar39 = 0;
LAB_00101a60:
  bVar43 = uVar21 + 0xaf <= uVar30;
  local_b0 = sVar25;
  iVar15 = iVar34;
  if (bVar43) {
    local_e0 = local_e0 + 1;
    uVar41 = uVar32;
    local_b0 = uVar36;
    uVar21 = uVar30;
    local_100 = uVar16;
    iVar15 = iVar34 + 1;
    iVar17 = iVar39;
  }
  bVar10 = 2 < iVar34;
  uVar16 = sVar25 + 9;
  uVar38 = uVar38 - 1;
  sVar25 = local_b0;
  iVar34 = iVar15;
  if (!bVar43 || (bVar10 || uVar2 <= uVar16)) goto LAB_00101cfe;
  goto LAB_001017f1;
code_r0x0010198d:
  uVar19 = uVar19 + 1;
  lVar20 = lVar20 + -8;
  if (uVar38 >> 3 == uVar19) goto code_r0x00101999;
  goto LAB_00101980;
code_r0x00101999:
  uVar32 = -lVar20;
  piVar24 = (int *)((long)piVar3 - lVar20);
LAB_00101bfe:
  uVar19 = uVar18 & 7;
  for (; (uVar19 != 0 && (ringbuffer[uVar32 + uVar28] == (uint8_t)*piVar24)); uVar32 = uVar32 + 1) {
    piVar24 = (int *)((long)piVar24 + 1);
    uVar19 = uVar19 - 1;
  }
LAB_001019ca:
  if (3 < uVar32) {
    iVar15 = 0x1f;
    if ((uint)uVar16 != 0) {
      for (; (uint)uVar16 >> iVar15 == 0; iVar15 = iVar15 + -1) {
      }
    }
    uVar30 = (ulong)(iVar15 * -0x1e + 0x780) + uVar32 * 0x87;
    if (0x7e4 < uVar30) goto LAB_00101a60;
  }
  lVar20 = *(long *)&(params->hasher).block_bits;
  if (*(ulong *)(lVar20 + 8) >> 7 <= *(ulong *)(lVar20 + 0x10)) {
    iVar39 = *piVar3;
    lVar9 = *(long *)(literal_context_lut + 0x78);
    *(long *)(lVar20 + 8) = *(long *)(lVar20 + 8) + 1;
    uVar16 = (ulong)((uint)(iVar39 * 0x1e35a7bd) >> 0x12);
    bVar14 = *(byte *)(lVar9 + uVar16 * 2);
    uVar19 = (ulong)bVar14;
    if (uVar19 != 0) {
      if (uVar19 <= uVar18) {
        uVar16 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar16 * 4);
        lVar9 = *(long *)(literal_context_lut + 0x58);
        pcVar26 = (char *)(uVar16 * uVar19 + *(long *)(lVar9 + 0xa8) +
                          (ulong)*(uint *)(lVar9 + 0x20 + uVar19 * 4));
        if (7 < bVar14) {
          uVar42 = (ulong)(bVar14 & 0xfffffff8);
          lVar22 = 0;
          uVar32 = 0;
LAB_00101b15:
          if (*(ulong *)(pcVar26 + uVar32 * 8) == *(ulong *)(piVar3 + uVar32 * 2))
          goto code_r0x00101b22;
          uVar42 = *(ulong *)(piVar3 + uVar32 * 2) ^ *(ulong *)(pcVar26 + uVar32 * 8);
          uVar32 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
            }
          }
          uVar32 = (uVar32 >> 3 & 0x1fffffff) - lVar22;
          goto LAB_00101b68;
        }
        uVar42 = 0;
        goto LAB_00101c58;
      }
      goto LAB_00101a42;
    }
  }
LAB_00101a5b:
  iVar39 = 0;
  uVar30 = 0x7e4;
  uVar16 = 0;
  uVar32 = 0;
  goto LAB_00101a60;
code_r0x00101b22:
  uVar32 = uVar32 + 1;
  lVar22 = lVar22 + -8;
  if (bVar14 >> 3 == uVar32) goto code_r0x00101b2e;
  goto LAB_00101b15;
code_r0x00101b2e:
  pcVar26 = pcVar26 + -lVar22;
LAB_00101c58:
  uVar30 = uVar19 & 7;
  uVar32 = uVar42;
  if ((bVar14 & 7) != 0) {
    uVar31 = uVar42 | uVar30;
    do {
      uVar32 = uVar42;
      if (*(char *)((long)piVar3 + uVar42) != *pcVar26) break;
      pcVar26 = pcVar26 + 1;
      uVar42 = uVar42 + 1;
      uVar30 = uVar30 - 1;
      uVar32 = uVar31;
    } while (uVar30 != 0);
  }
LAB_00101b68:
  if (((uVar32 == 0) || (*(uint *)(literal_context_lut + 100) + uVar32 <= uVar19)) ||
     (uVar16 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar19 - uVar32) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar19 - uVar32) * 4 << (*(byte *)(lVar9 + uVar19) & 0x3f)) + uVar23 + 1 + uVar16,
     uVar8 < uVar16)) {
LAB_00101a42:
    iVar39 = 0;
    bVar43 = true;
    uVar16 = 0;
    uVar32 = 0;
    uVar30 = 0x7e4;
  }
  else {
    iVar39 = 0x1f;
    if ((uint)uVar16 != 0) {
      for (; (uint)uVar16 >> iVar39 == 0; iVar39 = iVar39 + -1) {
      }
    }
    uVar30 = (uVar32 * 0x87 - (ulong)(uint)(iVar39 * 0x1e)) + 0x780;
    if (uVar30 < 0x7e4) goto LAB_00101a42;
    iVar39 = (uint)bVar14 - (int)uVar32;
    bVar43 = false;
  }
  if (!bVar43) {
    *(long *)(lVar20 + 0x10) = *(long *)(lVar20 + 0x10) + 1;
  }
  goto LAB_00101a60;
LAB_00101cfe:
  uVar13 = lVar6 + local_b0;
  if (uVar37 <= lVar6 + local_b0) {
    uVar13 = uVar37;
  }
  if (uVar13 < local_100) {
LAB_00101ef8:
    uVar18 = local_100 + 0xf;
  }
  else {
    uVar18 = (ulong)*(int *)&(hasher->common).extra;
    uVar33 = 0;
    bVar43 = false;
    if (local_100 != uVar18) {
      uVar38 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      if (local_100 == uVar38) {
        uVar33 = 1;
LAB_00101d67:
        bVar43 = false;
      }
      else {
        uVar18 = (local_100 + 3) - uVar18;
        if (uVar18 < 7) {
          iVar34 = (int)uVar18;
          uVar33 = 0x9750468;
        }
        else {
          uVar38 = (local_100 + 3) - uVar38;
          if (6 < uVar38) {
            if (local_100 != (long)(int)(hasher->common).dict_num_lookups) {
              bVar43 = local_100 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
              uVar33 = 3;
              goto LAB_00101ef4;
            }
            uVar33 = 2;
            goto LAB_00101d67;
          }
          iVar34 = (int)uVar38;
          uVar33 = 0xfdb1ace;
        }
        uVar33 = uVar33 >> ((byte)(iVar34 << 2) & 0x1f) & 0xf;
        bVar43 = false;
      }
    }
LAB_00101ef4:
    if (bVar43) goto LAB_00101ef8;
    uVar18 = (ulong)uVar33;
  }
  if ((local_100 <= uVar13) && (uVar18 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
    *(int *)&(hasher->common).extra = (int)local_100;
  }
  uVar33 = (uint)local_e0;
  *(uint *)psVar40 = uVar33;
  *(uint *)((long)psVar40 + 4) = iVar17 << 0x19 | (uint)uVar41;
  uVar13 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  if (uVar18 < uVar13) {
    *(short *)((long)psVar40 + 0xe) = (short)uVar18;
    uVar28 = 0;
  }
  else {
    bVar14 = (byte)*(int *)(literal_context_lut + 0x40);
    uVar18 = ((uVar18 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar14 & 0x3f))) - 0x10;
    uVar28 = 0x1f;
    if ((uint)uVar18 != 0) {
      for (; (uint)uVar18 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    uVar28 = (uVar28 ^ 0xffffffe0) + 0x1f;
    bVar43 = (uVar18 >> ((ulong)uVar28 & 0x3f) & 1) != 0;
    iVar34 = uVar28 - *(int *)(literal_context_lut + 0x40);
    *(ushort *)((long)psVar40 + 0xe) =
         (short)((uint)bVar43 + iVar34 * 2 + 0xfffe << (bVar14 & 0x3f)) +
         (short)uVar13 + (~(ushort)(-1 << (bVar14 & 0x1f)) & (ushort)uVar18) | (short)iVar34 * 0x400
    ;
    uVar28 = (uint)(uVar18 - ((ulong)bVar43 + 2 << ((byte)uVar28 & 0x3f)) >> (bVar14 & 0x3f));
  }
  *(uint *)(psVar40 + 1) = uVar28;
  if (5 < local_e0) {
    if (local_e0 < 0x82) {
      uVar33 = 0x1f;
      uVar28 = (uint)(local_e0 - 2);
      if (uVar28 != 0) {
        for (; uVar28 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar33 = (int)(local_e0 - 2 >> ((char)(uVar33 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar33 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_e0 < 0x842) {
      uVar28 = 0x1f;
      if (uVar33 - 0x42 != 0) {
        for (; uVar33 - 0x42 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar33 = (uVar28 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar33 = 0x15;
      if (0x1841 < local_e0) {
        uVar33 = (uint)(ushort)(0x17 - (local_e0 < 0x5842));
      }
    }
  }
  uVar28 = iVar17 + (uint)uVar41;
  if (uVar28 < 10) {
    uVar29 = uVar28 - 2;
  }
  else if (uVar28 < 0x86) {
    uVar28 = uVar28 - 6;
    uVar29 = 0x1f;
    if (uVar28 != 0) {
      for (; uVar28 >> uVar29 == 0; uVar29 = uVar29 - 1) {
      }
    }
    uVar29 = (int)((ulong)(long)(int)uVar28 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar29 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar29 = 0x17;
    if (uVar28 < 0x846) {
      uVar29 = 0x1f;
      if (uVar28 - 0x46 != 0) {
        for (; uVar28 - 0x46 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      uVar29 = (uVar29 ^ 0xffe0) + 0x2c;
    }
  }
  uVar11 = (ushort)uVar29;
  uVar27 = (uVar11 & 7) + ((ushort)uVar33 & 7) * 8;
  if ((((*(ushort *)((long)psVar40 + 0xe) & 0x3ff) == 0) && ((ushort)uVar33 < 8)) && (uVar11 < 0x10)
     ) {
    if (7 < uVar11) {
      uVar27 = uVar27 | 0x40;
    }
  }
  else {
    iVar17 = ((uVar33 & 0xffff) >> 3) * 3 + ((uVar29 & 0xffff) >> 3);
    uVar27 = uVar27 + ((ushort)(0x520d40 >> ((char)iVar17 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar17 * 0x40 + 0x40;
  }
  *(ushort *)((long)psVar40 + 0xc) = uVar27;
  *num_commands = *num_commands + local_e0;
  position = local_b0 + uVar41;
  uVar13 = uVar12;
  if (position < uVar12) {
    uVar13 = position;
  }
  uVar18 = local_b0 + 2;
  if (local_100 < uVar41 >> 2) {
    uVar38 = position + local_100 * -4;
    if (uVar38 < uVar18) {
      uVar38 = uVar18;
    }
    uVar18 = uVar38;
    if (uVar13 < uVar38) {
      uVar18 = uVar13;
    }
  }
  local_b0 = lVar35 + uVar41 * 2 + local_b0;
  psVar40 = psVar40 + 2;
  if (uVar18 < uVar13) {
    do {
      *(int *)(lVar7 + ((ulong)(*(long *)(ringbuffer + (uVar18 & ringbuffer_mask)) *
                               -0x42e1ca5843000000) >> 0x30) * 4) = (int)uVar18;
      uVar18 = uVar18 + 1;
    } while (uVar13 != uVar18);
    local_e0 = 0;
  }
  else {
    local_e0 = 0;
  }
LAB_0010219d:
  sVar25 = position;
  if (uVar2 <= position + 8) goto LAB_00102375;
  goto LAB_00101516;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}